

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ab_algorithm.c
# Opt level: O0

void aba_a(void)

{
  point *ppVar1;
  kca_joint *joint_2;
  int i_2;
  kca_joint *joint_1;
  int i_1;
  kca_joint *joint;
  int local_100;
  int i;
  solver_state_a s;
  kca_kinematic_chain *kc;
  
  s.f_ext_tf = (ma_wrench *)&two_dof_robot_a;
  setup_simple_state_a(&two_dof_robot_a,&local_100);
  for (joint._4_4_ = 1; joint._4_4_ < local_100 + 1; joint._4_4_ = joint._4_4_ + 1) {
    ppVar1 = (s.f_ext_tf)->point + (long)(joint._4_4_ + -1) * 0xc + 4;
    kca_fpk(ppVar1,s._8_8_ + (long)(joint._4_4_ + -1) * 0x20);
    ga_pose_compose(s._8_8_ + (long)(joint._4_4_ + -1) * 0x20,
                    (s.f_ext_tf)->point + (long)(joint._4_4_ + -1) * 0xc,
                    s.x_jnt + (joint._4_4_ + -1));
    kca_fvk(ppVar1,s.x_tot + (joint._4_4_ + -1));
    ga_twist_tf_ref_to_tgt
              (s.x_jnt + (joint._4_4_ + -1),s.xd_tf + (joint._4_4_ + -1),
               s.xd_jnt + (joint._4_4_ + -1));
    ga_twist_accumulate(s.xd_jnt + (joint._4_4_ + -1),s.x_tot + (joint._4_4_ + -1),
                        s.xd_tf + joint._4_4_);
    kca_inertial_acceleration(ppVar1,s.xd_tf + joint._4_4_,s.xdd_jnt + (joint._4_4_ + -1));
    ma_rbi_to_abi((s.f_ext_tf)->point + (long)(joint._4_4_ + -1) * 0xc + 9,
                  &(s.xdd)->target_body + (long)joint._4_4_ * 3);
    ma_rbi_map_twist_to_momentum
              ((s.f_ext_tf)->point + (long)(joint._4_4_ + -1) * 0xc + 9,s.xd_tf + joint._4_4_,
               s.m_tf + (joint._4_4_ + -1));
    ma_momentum_derive(s.xd_tf + joint._4_4_,s.m_tf + (joint._4_4_ + -1),s.p + joint._4_4_);
    ma_wrench_invert(s.f_ff_jnt + (joint._4_4_ + -1),s.f_ext + joint._4_4_);
  }
  for (joint_1._4_4_ = local_100; 0 < joint_1._4_4_; joint_1._4_4_ = joint_1._4_4_ + -1) {
    ppVar1 = (s.f_ext_tf)->point + (long)(joint_1._4_4_ + -1) * 0xc + 4;
    kca_project_inertia(ppVar1,&(s.xdd)->target_body + (long)joint_1._4_4_ * 3,
                        s.m_art + (joint_1._4_4_ + -1));
    ma_abi_tf_tgt_to_ref
              (s.x_jnt + (joint_1._4_4_ + -1),s.m_art + (joint_1._4_4_ + -1),s.m_app + joint_1._4_4_
              );
    ma_abi_add(&(s.xdd)->target_body + (long)(joint_1._4_4_ + -1) * 3,s.m_app + joint_1._4_4_,
               &(s.xdd)->target_body + (long)(joint_1._4_4_ + -1) * 3);
    ma_abi_map_acc_twist_to_wrench
              (&(s.xdd)->target_body + (long)joint_1._4_4_ * 3,s.xdd_jnt + (joint_1._4_4_ + -1),
               s.f_bias_art + (joint_1._4_4_ + -1));
    ma_wrench_add(s.f_bias_art + (joint_1._4_4_ + -1),s.p + joint_1._4_4_,
                  s.f_bias_art + (joint_1._4_4_ + -1));
    kca_project_wrench(ppVar1,&(s.xdd)->target_body + (long)joint_1._4_4_ * 3,
                       s.f_bias_art + (joint_1._4_4_ + -1),s.f_bias_eom + (joint_1._4_4_ + -1));
    ma_wrench_tf_tgt_to_ref
              (s.x_jnt + (joint_1._4_4_ + -1),s.f_bias_eom + (joint_1._4_4_ + -1),
               s.f_bias_app + (joint_1._4_4_ + -1));
    ma_wrench_add(s.p + (joint_1._4_4_ + -1),s.f_bias_app + (joint_1._4_4_ + -1),
                  s.p + (joint_1._4_4_ + -1));
    kca_ffd(ppVar1,&(s.xdd)->target_body + (long)joint_1._4_4_ * 3,s.f_ff_app + (joint_1._4_4_ + -1)
           );
    kca_project_wrench(ppVar1,&(s.xdd)->target_body + (long)joint_1._4_4_ * 3,
                       s.f_bias_nact + joint_1._4_4_,s.f_ff_art + (joint_1._4_4_ + -1));
    ma_wrench_add(s.f_ff_art + (joint_1._4_4_ + -1),s.f_ff_app + (joint_1._4_4_ + -1),
                  s.f_ff_art + (joint_1._4_4_ + -1));
    ma_wrench_tf_tgt_to_ref
              (s.x_jnt + (joint_1._4_4_ + -1),s.f_ff_art + (joint_1._4_4_ + -1),
               s.f_bias_nact + (joint_1._4_4_ + -1));
    kca_project_wrench(ppVar1,&(s.xdd)->target_body + (long)joint_1._4_4_ * 3,
                       s.f_ext + joint_1._4_4_,s.f_ext_art + (joint_1._4_4_ + -1));
    ma_wrench_tf_tgt_to_ref
              (s.x_jnt + (joint_1._4_4_ + -1),s.f_ext_art + (joint_1._4_4_ + -1),
               s.f_ext_app + (joint_1._4_4_ + -1));
    ma_wrench_add(s.f_ext + (joint_1._4_4_ + -1),s.f_ext_app + (joint_1._4_4_ + -1),
                  s.f_ext + (joint_1._4_4_ + -1));
  }
  ma_abi_log(s.xdd);
  ma_wrench_log(s.p);
  ma_wrench_log(s.f_bias_nact);
  ma_wrench_log(s.f_ext);
  for (joint_2._4_4_ = 1; joint_2._4_4_ < local_100 + 1; joint_2._4_4_ = joint_2._4_4_ + 1) {
    ppVar1 = (s.f_ext_tf)->point + (long)(joint_2._4_4_ + -1) * 0xc + 4;
    ga_acc_twist_tf_ref_to_tgt
              (s.x_jnt + (joint_2._4_4_ + -1),s.xdd_nact + (joint_2._4_4_ + -1),
               s.xdd_net + (joint_2._4_4_ + -1));
    ga_acc_twist_accumulate
              (s.xdd_net + (joint_2._4_4_ + -1),s.xdd_jnt + (joint_2._4_4_ + -1),
               s.xdd_tf + (joint_2._4_4_ + -1));
    ma_abi_map_acc_twist_to_wrench
              (&(s.xdd)->target_body + (long)joint_2._4_4_ * 3,s.xdd_tf + (joint_2._4_4_ + -1),
               s.f_bias_tf + (joint_2._4_4_ + -1));
    kca_ifk(ppVar1,s.f_bias_tf + (joint_2._4_4_ + -1));
    kca_ifk(ppVar1,s.f_bias_nact + joint_2._4_4_);
    kca_ifk(ppVar1,s.f_ext + joint_2._4_4_);
    kca_fak(ppVar1,s.xd + (joint_2._4_4_ + -1));
    ga_acc_twist_add(s.xd + (joint_2._4_4_ + -1),s.xdd_jnt + (joint_2._4_4_ + -1),
                     s.xdd_bias + (joint_2._4_4_ + -1));
    ga_acc_twist_accumulate
              (s.xdd_net + (joint_2._4_4_ + -1),s.xdd_bias + (joint_2._4_4_ + -1),
               s.xdd_nact + joint_2._4_4_);
  }
  ga_acc_twist_log(s.xdd_nact + local_100);
  return;
}

Assistant:

void aba_a()
{
    struct kca_kinematic_chain *kc = &two_dof_robot_a;
    struct solver_state_a s;

    setup_simple_state_a(kc, &s);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Position
        //

        // X_{J,i}
        kca_fpk(joint, &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        ga_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);


        // Velocity
        //

        // Xd_{J,i} = S qd
        kca_fvk(joint, &s.xd_jnt[i - 1]);

        // Xd_{i-1}' = i^X_{i-1} Xd_{i-1}
        ga_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xd[i - 1], &s.xd_tf[i - 1]);

        // Xd_i = Xd_{i-1}' + Xd_{J,i}
        ga_twist_accumulate(&s.xd_tf[i - 1], &s.xd_jnt[i - 1], &s.xd[i]);


        // Acceleration
        //

        // Xdd_{bias,i} = S_i qdd_i + Sd_i qd_i + Xd_i x S_i qd_i
        kca_inertial_acceleration(joint, &s.xd[i], &s.xdd_bias[i - 1]);


        // Inertia
        //

        // M_i^A = M_i
        ma_rbi_to_abi(&kc->segment[i - 1].link.inertia, &s.m_art[i]);


        // Force
        //

        // p_i = M_i Xd_i
        ma_rbi_map_twist_to_momentum(&kc->segment[i - 1].link.inertia, &s.xd[i], &s.p[i - 1]);

        // F_{bias,i}^A = Xd_i x* P_i
        ma_momentum_derive(&s.xd[i], &s.p[i - 1], &s.f_bias_art[i]);


        // F_{ext,i}^A = -F_{ext,i}
        ma_wrench_invert(&s.f_ext[i - 1], &s.f_ext_art[i]);
    }


    for (int i = s.nbody; i > 0; i--) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Inertia
        //

        // M_i^a = P_i^T M_i^A
        kca_project_inertia(joint, &s.m_art[i], &s.m_app[i - 1]);

        // M_{i-1}^a' = {i-1}^X_i* M_i^a i^X_{i-1}
        ma_abi_tf_tgt_to_ref(&s.x_rel[i - 1], &s.m_app[i - 1], &s.m_tf[i]);

        // M_{i-1}^A += M_{i-1}^a'
        ma_abi_add(&s.m_art[i - 1], &s.m_tf[i], &s.m_art[i - 1]);


        // Force
        //

        // F_{bias,i}^A' = M_i^A Xdd_{bias,i}
        ma_abi_map_acc_twist_to_wrench(&s.m_art[i], &s.xdd_bias[i - 1], &s.f_bias_eom[i - 1]);

        // F_{bias,i}^A' += F_{bias,i}^A
        ma_wrench_add(&s.f_bias_eom[i - 1], &s.f_bias_art[i], &s.f_bias_eom[i - 1]);

        // F_{bias,i}^a = P_i^T F_{bias,i}^A'
        kca_project_wrench(joint, &s.m_art[i], &s.f_bias_eom[i - 1], &s.f_bias_app[i - 1]);

        // F_{bias,i}^a' = {i-1}^X_i* F_{bias,i}^a
        ma_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_bias_app[i - 1], &s.f_bias_tf[i - 1]);

        // F_{bias,i-1}^A += F_{bias,i}^a'
        ma_wrench_add(&s.f_bias_art[i - 1], &s.f_bias_tf[i - 1], &s.f_bias_art[i - 1]);


        // F_{tau,i} = M_i^A S_i D^{-1} tau_{ff,i}
        kca_ffd(joint, &s.m_art[i], &s.f_ff_jnt[i - 1]);

        // F_{tau,i}^a = P_i^T F_{tau,i}^A
        kca_project_wrench(joint, &s.m_art[i], &s.f_ff_art[i], &s.f_ff_app[i - 1]);

        // F_{tau,i}^a += F_{tau,i}'
        ma_wrench_add(&s.f_ff_app[i - 1], &s.f_ff_jnt[i - 1], &s.f_ff_app[i - 1]);

        // F_{tau,i-1}^A = {i-1}^X_i* F_{tau,i}^a
        ma_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_ff_app[i - 1], &s.f_ff_art[i - 1]);


        // F_{ext,i}^a = P_i^T F_{ext,i}^A
        kca_project_wrench(joint, &s.m_art[i], &s.f_ext_art[i], &s.f_ext_app[i - 1]);

        // F_{ext,i}^a' = {i-1}^X_i* F_{ext,i}^a
        ma_wrench_tf_tgt_to_ref(&s.x_rel[i - 1], &s.f_ext_app[i - 1], &s.f_ext_tf[i - 1]);

        // F_{ext,i-1}^A += F_{ext,i}^a'
        ma_wrench_add(&s.f_ext_art[i - 1], &s.f_ext_tf[i - 1], &s.f_ext_art[i - 1]);
    }

    ma_abi_log(&s.m_art[0]);
    ma_wrench_log(&s.f_bias_art[0]);
    ma_wrench_log(&s.f_ff_art[0]);
    ma_wrench_log(&s.f_ext_art[0]);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Acceleration
        //

        // Xdd_{i-1}' = i^X_{i-1} Xdd_{i-1}
        ga_acc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xdd[i - 1], &s.xdd_tf[i - 1]);

        // Xdd_{nact,i-1} = Xdd_{i-1}' + Xdd_{bias,i-1}
        ga_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_bias[i - 1], &s.xdd_nact[i - 1]);


        // Force
        //

        // F_{nact,i} = M_i^A Xdd_{nact,i-1}'
        ma_abi_map_acc_twist_to_wrench(&s.m_art[i], &s.xdd_nact[i - 1], &s.f_bias_nact[i - 1]);

        // tau_{bias,i} = S^T F_{bias,i}
        kca_ifk(joint, &s.f_bias_nact[i - 1]);


        // tau_{ff,i}^A = S^T F_{ff,i}
        kca_ifk(joint, &s.f_ff_art[i]);


        // tau_{ext,i}^A = S^T F_{ext,i}
        kca_ifk(joint, &s.f_ext_art[i]);


        // Resultant acceleration
        //

        // Xdd_{J,i} = S_i qdd_i
        kca_fak(joint, &s.xdd_jnt[i - 1]);

        // Xdd_{J,i}' = Xdd_{J,i} + Xdd_{bias,i}
        ga_acc_twist_add(&s.xdd_jnt[i - 1], &s.xdd_bias[i - 1], &s.xdd_net[i - 1]);

        // Xdd_i = Xdd_{i-1}' + Xdd_{J,i}'
        ga_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_net[i - 1], &s.xdd[i]);
    }

    ga_acc_twist_log(&s.xdd[s.nbody]);
}